

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O1

Result * __thiscall
CoreML::
validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
          (Result *__return_storage_ptr__,CoreML *this,
          RepeatedPtrField<CoreML::Specification::FeatureDescription> *features,int maxFeatureCount,
          vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
          *allowedFeatureTypes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  bool bVar3;
  Type *featureDesc;
  long *plVar4;
  uint uVar5;
  undefined4 in_register_0000000c;
  size_type *psVar6;
  ulong uVar7;
  uint __val;
  int index;
  uint uVar8;
  uint __len;
  Result result;
  size_type *local_a0;
  _Alloc_hider local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined1 local_78 [8];
  _Alloc_hider local_70;
  undefined1 local_68 [24];
  long *local_50 [2];
  long local_40 [2];
  
  Result::Result((Result *)&local_a0);
  uVar8 = (uint)features;
  if ((uVar8 == 0) || (*(int *)(this + 8) <= (int)uVar8)) {
    if (0 < *(int *)(this + 8)) {
      index = 0;
      do {
        featureDesc = google::protobuf::internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                                ((RepeatedPtrFieldBase *)this,index);
        validateSchemaTypes((Result *)local_78,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)CONCAT44(in_register_0000000c,maxFeatureCount),featureDesc);
        local_a0 = (size_type *)local_78;
        std::__cxx11::string::operator=((string *)&local_98,(string *)&local_70);
        if (local_70._M_p != local_68 + 8) {
          operator_delete(local_70._M_p,local_68._8_8_ + 1);
        }
        bVar3 = Result::good((Result *)&local_a0);
      } while ((bVar3) && (index = index + 1, index < *(int *)(this + 8)));
    }
    *(size_type **)__return_storage_ptr__ = local_a0;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p == &local_88) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_88._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_98._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_90;
    local_90 = 0;
    local_88._M_local_buf[0] = '\0';
    local_98._M_p = (pointer)&local_88;
  }
  else {
    __val = -uVar8;
    if (0 < (int)uVar8) {
      __val = uVar8;
    }
    __len = 1;
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar2 = 4;
      do {
        __len = uVar2;
        uVar5 = (uint)uVar7;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_00272415;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_00272415;
        }
        if (uVar5 < 10000) goto LAB_00272415;
        uVar7 = uVar7 / 10000;
        uVar2 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_00272415:
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct
              ((ulong)local_50,(char)__len - ((char)((ulong)features >> 0x18) >> 7));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar8 >> 0x1f) + (long)local_50[0]),__len,__val);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x320af3);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      local_68._0_8_ = *psVar6;
      local_68._8_8_ = plVar4[3];
      local_78 = (undefined1  [8])local_68;
    }
    else {
      local_68._0_8_ = *psVar6;
      local_78 = (undefined1  [8])*plVar4;
    }
    local_70._M_p = (pointer)plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Result::Result(__return_storage_ptr__,TOO_MANY_FEATURES_FOR_MODEL_TYPE,(string *)local_78);
    if (local_78 != (undefined1  [8])local_68) {
      operator_delete((void *)local_78,local_68._0_8_ + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Result validateDescriptionsContainFeatureWithTypes(const Descriptions &features,
                                                              int maxFeatureCount,
                                                              const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes) {
        Result result;
        
        // 0 means no maximum fixed feature count.
        if (maxFeatureCount != 0 && features.size() > maxFeatureCount) {
            return Result(ResultType::TOO_MANY_FEATURES_FOR_MODEL_TYPE, "Feature descriptions exceeded " + std::to_string(maxFeatureCount));
        }
        
        for (int i = 0; i < features.size(); i++) {
            result = validateSchemaTypes(allowedFeatureTypes, features[i]);
            if (!result.good()) {
                return result;
            }
        }
        
        return result;
    }